

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O0

bool __thiscall QCheckBox::hitButton(QCheckBox *this,QPoint *pos)

{
  byte bVar1;
  QStyle *pQVar2;
  bool in_SIL;
  QStyleOptionButton *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionButton opt;
  QWidget *in_stack_ffffffffffffff48;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x52e2f2);
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0x1b8))(in_RDI,&local_78);
  pQVar2 = QWidget::style(in_stack_ffffffffffffff48);
  local_88 = (**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,5,&local_78,in_RDI);
  bVar1 = QRect::contains((QPoint *)local_88,in_SIL);
  QStyleOptionButton::~QStyleOptionButton(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QCheckBox::hitButton(const QPoint &pos) const
{
    QStyleOptionButton opt;
    initStyleOption(&opt);
    return style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, this).contains(pos);
}